

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

SQInteger __thiscall SQFuncState::CountOuters(SQFuncState *this,SQInteger stacksize)

{
  SQUnsignedInteger SVar1;
  long lVar2;
  long lVar3;
  SQUnsignedInteger *pSVar4;
  
  SVar1 = (this->_vlocals)._size;
  lVar3 = SVar1 - 1;
  if (lVar3 < stacksize) {
    return 0;
  }
  pSVar4 = &(this->_vlocals)._vals[SVar1 - 1]._end_op;
  lVar2 = 0;
  do {
    lVar2 = lVar2 + (ulong)(*pSVar4 == 0xffffffffffffffff);
    lVar3 = lVar3 + -1;
    pSVar4 = pSVar4 + -5;
  } while (stacksize <= lVar3);
  return lVar2;
}

Assistant:

inline SQUnsignedInteger size() const { return _size; }